

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O0

bool __thiscall
WrittenFontTrueType::AddToANSIRepresentation
          (WrittenFontTrueType *this,GlyphUnicodeMappingListList *inGlyphsList,
          UShortListList *outEncodedCharacters)

{
  unsigned_short inEncodedCharacter;
  WrittenFontRepresentation *pWVar1;
  byte bVar2;
  bool bVar3;
  reference inGlyphsList_00;
  size_type sVar4;
  pointer plVar5;
  pointer this_00;
  pointer pGVar6;
  reference puVar7;
  pointer __x;
  byte local_1b1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_198;
  GlyphEncodingInfo local_180;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_160;
  _Self local_138;
  uint local_12c;
  _Self local_128;
  _Self local_120;
  _List_node_base *local_118;
  _List_node_base *local_110;
  _Self local_108;
  _List_iterator<unsigned_short> local_100;
  iterator itEncoded;
  const_iterator itGlyphs;
  iterator itEncodedList;
  const_iterator itGlyphsList;
  GlyphEncodingInfo local_d0;
  int local_ac;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_a8;
  _Self local_80;
  byte local_71;
  const_iterator cStack_70;
  bool result;
  const_iterator itList;
  int local_58;
  bool local_53;
  pair<bool,_unsigned_char> local_52;
  undefined1 local_50 [6];
  BoolAndByte encodingResult;
  UShortList candidates;
  UShortListList candidatesList;
  UShortListList *outEncodedCharacters_local;
  GlyphUnicodeMappingListList *inGlyphsList_local;
  WrittenFontTrueType *this_local;
  
  std::__cxx11::
  list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::list((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          *)&candidates.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             _M_node._M_size);
  std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::list
            ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  local_53 = true;
  local_58 = 0;
  std::pair<bool,_unsigned_char>::pair<bool,_int,_true>(&local_52,&local_53,&local_58);
  cStack_70 = std::__cxx11::
              list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
              ::begin(inGlyphsList);
  local_71 = 1;
  while( true ) {
    local_80._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
         ::end(inGlyphsList);
    bVar3 = std::operator!=(&stack0xffffffffffffff90,&local_80);
    local_1b1 = 0;
    if (bVar3) {
      local_1b1 = local_71;
    }
    if ((local_1b1 & 1) == 0) break;
    inGlyphsList_00 =
         std::
         _List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
         ::operator*(&stack0xffffffffffffff90);
    local_71 = AddANSICandidates(this,inGlyphsList_00,(UShortList *)local_50);
    if ((bool)local_71) {
      std::__cxx11::
      list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::push_back((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   *)&candidates.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl._M_node._M_size,(value_type *)local_50);
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear
                ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
    }
    std::
    _List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
    ::operator++(&stack0xffffffffffffff90);
  }
  if ((local_71 & 1) != 0) {
    sVar4 = std::
            map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
            ::size(&((this->super_AbstractWrittenFont).mANSIRepresentation)->mGlyphIDToEncodedChar);
    if (sVar4 == 0) {
      pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
      local_ac = 0;
      GlyphEncodingInfo::GlyphEncodingInfo(&local_d0,0,0);
      std::pair<const_unsigned_int,_GlyphEncodingInfo>::pair<int,_GlyphEncodingInfo,_true>
                (&local_a8,&local_ac,&local_d0);
      std::
      map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
      ::insert(&pWVar1->mGlyphIDToEncodedChar,&local_a8);
      std::pair<const_unsigned_int,_GlyphEncodingInfo>::~pair(&local_a8);
      GlyphEncodingInfo::~GlyphEncodingInfo(&local_d0);
    }
    itEncodedList._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
         ::begin(inGlyphsList);
    itGlyphs._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
         ::begin((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  *)&candidates.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl._M_node._M_size);
    std::_List_const_iterator<GlyphUnicodeMapping>::_List_const_iterator
              ((_List_const_iterator<GlyphUnicodeMapping> *)&itEncoded);
    std::_List_iterator<unsigned_short>::_List_iterator(&local_100);
    while( true ) {
      local_108._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
           ::end(inGlyphsList);
      bVar3 = std::operator!=((_Self *)&itEncodedList,&local_108);
      if (!bVar3) break;
      plVar5 = std::
               _List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
               ::operator->((_List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                             *)&itEncodedList);
      local_110 = (_List_node_base *)
                  std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::
                  begin(plVar5);
      itEncoded._M_node = local_110;
      this_00 = std::
                _List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                ::operator->((_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                              *)&itGlyphs);
      local_118 = (_List_node_base *)
                  std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                            (this_00);
      local_100._M_node = local_118;
      while( true ) {
        plVar5 = std::
                 _List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                 ::operator->((_List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                               *)&itEncodedList);
        local_120._M_node =
             (_List_node_base *)
             std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::end
                       (plVar5);
        bVar3 = std::operator!=((_Self *)&itEncoded,&local_120);
        if (!bVar3) break;
        pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
        pGVar6 = std::_List_const_iterator<GlyphUnicodeMapping>::operator->
                           ((_List_const_iterator<GlyphUnicodeMapping> *)&itEncoded);
        local_12c = (uint)pGVar6->mGlyphCode;
        local_128._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
             ::find(&pWVar1->mGlyphIDToEncodedChar,&local_12c);
        local_138._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
             ::end(&((this->super_AbstractWrittenFont).mANSIRepresentation)->mGlyphIDToEncodedChar);
        bVar3 = std::operator==(&local_128,&local_138);
        if (bVar3) {
          pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
          pGVar6 = std::_List_const_iterator<GlyphUnicodeMapping>::operator->
                             ((_List_const_iterator<GlyphUnicodeMapping> *)&itEncoded);
          puVar7 = std::_List_iterator<unsigned_short>::operator*(&local_100);
          inEncodedCharacter = *puVar7;
          __x = std::_List_const_iterator<GlyphUnicodeMapping>::operator->
                          ((_List_const_iterator<GlyphUnicodeMapping> *)&itEncoded);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_198,&__x->mUnicodeValues);
          GlyphEncodingInfo::GlyphEncodingInfo(&local_180,inEncodedCharacter,&local_198);
          std::pair<const_unsigned_int,_GlyphEncodingInfo>::
          pair<const_unsigned_short_&,_GlyphEncodingInfo,_true>
                    (&local_160,&pGVar6->mGlyphCode,&local_180);
          std::
          map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
          ::insert(&pWVar1->mGlyphIDToEncodedChar,&local_160);
          std::pair<const_unsigned_int,_GlyphEncodingInfo>::~pair(&local_160);
          GlyphEncodingInfo::~GlyphEncodingInfo(&local_180);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_198);
        }
        std::_List_const_iterator<GlyphUnicodeMapping>::operator++
                  ((_List_const_iterator<GlyphUnicodeMapping> *)&itEncoded);
        std::_List_iterator<unsigned_short>::operator++(&local_100);
      }
      std::
      _List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
      ::operator++((_List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                    *)&itEncodedList);
      std::_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>::
      operator++((_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)&itGlyphs);
    }
    std::__cxx11::
    list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ::operator=(outEncodedCharacters,
                (list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 *)&candidates.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl._M_node._M_size);
  }
  bVar2 = local_71;
  std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::~list
            ((list<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  std::__cxx11::
  list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~list((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
           *)&candidates.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              _M_node._M_size);
  return (bool)(bVar2 & 1);
}

Assistant:

bool WrittenFontTrueType::AddToANSIRepresentation(	const GlyphUnicodeMappingListList& inGlyphsList,
													UShortListList& outEncodedCharacters)
{
	UShortListList candidatesList;
	UShortList candidates;
	BoolAndByte encodingResult(true,0);
	GlyphUnicodeMappingListList::const_iterator itList = inGlyphsList.begin(); 
	bool result = true;

	for(; itList != inGlyphsList.end() && result; ++itList)
	{
		result = AddANSICandidates(*itList, candidates);
		if(result)
		{
			candidatesList.push_back(candidates);
			candidates.clear();
		}
	}

	if(result)
	{
		// for the first time, add also 0,0 mapping
		if(mANSIRepresentation->mGlyphIDToEncodedChar.size() == 0)
			mANSIRepresentation->mGlyphIDToEncodedChar.insert(UIntToGlyphEncodingInfoMap::value_type(0,GlyphEncodingInfo(0,0)));


		GlyphUnicodeMappingListList::const_iterator itGlyphsList = inGlyphsList.begin();
		UShortListList::iterator itEncodedList = candidatesList.begin();
		GlyphUnicodeMappingList::const_iterator itGlyphs;
		UShortList::iterator itEncoded;

		for(; itGlyphsList != inGlyphsList.end(); ++ itGlyphsList,++itEncodedList)
		{
			itGlyphs = itGlyphsList->begin();
			itEncoded = itEncodedList->begin();
			for(; itGlyphs != itGlyphsList->end(); ++ itGlyphs,++itEncoded)
			{
				if(mANSIRepresentation->mGlyphIDToEncodedChar.find(itGlyphs->mGlyphCode) == mANSIRepresentation->mGlyphIDToEncodedChar.end())
					mANSIRepresentation->mGlyphIDToEncodedChar.insert(
					UIntToGlyphEncodingInfoMap::value_type(itGlyphs->mGlyphCode,GlyphEncodingInfo(*itEncoded,itGlyphs->mUnicodeValues)));
			}
		}

		outEncodedCharacters = candidatesList;
	}

	return result;	
}